

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareDwa.cpp
# Opt level: O0

half toNonlinear(half linear)

{
  uint16_t uVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float logBase;
  float sign;
  float in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  float local_8;
  half local_4;
  uint16_t local_2;
  
  local_8 = 1.0;
  dVar4 = pow(2.7182818,2.2);
  fVar2 = (float)dVar4;
  fVar3 = Imath_3_2::half::operator_cast_to_float((half *)CONCAT44(fVar2,in_stack_fffffffffffffff0))
  ;
  if (fVar3 < 0.0) {
    local_8 = -1.0;
  }
  uVar1 = Imath_3_2::half::bits(&local_4);
  if ((uVar1 & 0x7c00) == 0x7c00) {
    Imath_3_2::half::half
              ((half *)CONCAT44(fVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  else {
    fVar3 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(fVar2,in_stack_fffffffffffffff0));
    dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar3));
    if (1.0 < SUB84(dVar4,0)) {
      fVar3 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(fVar2,in_stack_fffffffffffffff0));
      dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db_01,fVar3));
      std::log(dVar4);
      std::log((double)(ulong)(uint)fVar2);
      Imath_3_2::half::half((half *)CONCAT44(fVar2,in_stack_fffffffffffffff0),local_8);
    }
    else {
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)CONCAT44(fVar2,local_8));
      dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db_00,fVar3));
      std::pow(dVar4,5.21456351771692e-315);
      Imath_3_2::half::half((half *)CONCAT44(fVar2,local_8),in_stack_ffffffffffffffec);
    }
  }
  return (half)local_2;
}

Assistant:

half
toNonlinear (half linear)
{
    float sign    = 1;
    float logBase = pow (2.7182818, 2.2);

    if ((float) linear < 0) { sign = -1; }

    if ((linear.bits () & 0x7c00) == 0x7c00) { return (half) 0.0; }

    if (fabs ((float) linear) <= 1.0f)
    {
        return (half) (sign * pow (fabs ((float) linear), 1.f / 2.2f));
    }

    return (half) (sign * (log (fabs ((float) linear)) / log (logBase) + 1.0f));
}